

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O2

string * __thiscall Env::DataTypeStr_abi_cxx11_(string *__return_storage_ptr__,Env *this,ID *id)

{
  Type *pTVar1;
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  pTVar1 = GetDataType(this,id);
  if (pTVar1 != (Type *)0x0) {
    (*(pTVar1->super_DataDepElement)._vptr_DataDepElement[0xb])(__return_storage_ptr__,pTVar1);
    return __return_storage_ptr__;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"data type not defined",&local_39);
  Exception::Exception(this_00,&id->super_Object,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

string Env::DataTypeStr(const ID* id) const
	{
	Type* type = GetDataType(id);
	if ( ! type )
		throw Exception(id, "data type not defined");
	return type->DataTypeStr();
	}